

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRResampler.cpp
# Opt level: O1

void __thiscall
SRCTools::FIRResampler::process
          (FIRResampler *this,FloatSample **inSamples,uint *inLength,FloatSample **outSamples,
          uint *outLength)

{
  uint uVar1;
  
  uVar1 = *outLength;
  do {
    if (uVar1 == 0) {
      return;
    }
    while ((double)(this->constants).numberOfPhases <= this->phase) {
      if (*inLength == 0) {
        return;
      }
      addInSamples(this,inSamples);
      *inLength = *inLength - 1;
    }
    getOutSamplesStereo(this,outSamples);
    *outLength = *outLength - 1;
    uVar1 = *outLength;
  } while( true );
}

Assistant:

void FIRResampler::process(const FloatSample *&inSamples, unsigned int &inLength, FloatSample *&outSamples, unsigned int &outLength) {
	while (outLength > 0) {
		while (needNextInSample()) {
			if (inLength == 0) return;
			addInSamples(inSamples);
			--inLength;
		}
		getOutSamplesStereo(outSamples);
		--outLength;
	}
}